

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDG2Dot.h
# Opt level: O2

void __thiscall
dg::llvmdg::SDG2Dot::dumpParams(SDG2Dot *this,ostream *out,DGParameters *params,string *name)

{
  DGNode *pDVar1;
  undefined8 *puVar2;
  DGElement *pDVar3;
  DGParameters *pDVar4;
  ostream *poVar5;
  Value *pVVar6;
  undefined8 *puVar7;
  DGNode *noret;
  DGParameters *__range2;
  DGNode *local_50;
  _Rb_tree<dg::sdg::DGNode*,dg::sdg::DGNode*,std::_Identity<dg::sdg::DGNode*>,std::less<dg::sdg::DGNode*>,std::allocator<dg::sdg::DGNode*>>
  *local_48;
  DGParameters *local_40;
  string *local_38;
  
  poVar5 = std::operator<<(out,"    subgraph cluster_params_in_");
  poVar5 = std::ostream::_M_insert<void_const*>(poVar5);
  std::operator<<(poVar5," {\n");
  poVar5 = std::operator<<(out,"      label=\"");
  local_38 = name;
  poVar5 = std::operator<<(poVar5,(string *)name);
  std::operator<<(poVar5," (input)\"\n");
  puVar2 = *(undefined8 **)(params + 0x20);
  local_48 = (_Rb_tree<dg::sdg::DGNode*,dg::sdg::DGNode*,std::_Identity<dg::sdg::DGNode*>,std::less<dg::sdg::DGNode*>,std::allocator<dg::sdg::DGNode*>>
              *)&this->dumpedNodes;
  local_40 = params;
  for (puVar7 = *(undefined8 **)(params + 0x18); puVar7 != puVar2; puVar7 = puVar7 + 1) {
    pDVar3 = (DGElement *)*puVar7;
    pDVar1 = (DGNode *)(pDVar3 + 0x20);
    local_50 = pDVar1;
    std::
    _Rb_tree<dg::sdg::DGNode*,dg::sdg::DGNode*,std::_Identity<dg::sdg::DGNode*>,std::less<dg::sdg::DGNode*>,std::allocator<dg::sdg::DGNode*>>
    ::_M_insert_unique<dg::sdg::DGNode*>(local_48,&local_50);
    pVVar6 = SystemDependenceGraph::getValue(this->_llvmsdg,pDVar3);
    dumpNode(this,out,pDVar1,pVVar6,(char *)0x0);
  }
  std::operator<<(out,"    }\n");
  poVar5 = std::operator<<(out,"    subgraph cluster_params_out_");
  pDVar4 = local_40;
  poVar5 = std::ostream::_M_insert<void_const*>(poVar5);
  std::operator<<(poVar5," {\n");
  poVar5 = std::operator<<(out,"      label=\"");
  poVar5 = std::operator<<(poVar5,(string *)local_38);
  std::operator<<(poVar5," (output)\"\n");
  puVar2 = *(undefined8 **)(pDVar4 + 0x20);
  for (puVar7 = *(undefined8 **)(pDVar4 + 0x18); puVar7 != puVar2; puVar7 = puVar7 + 1) {
    pDVar3 = (DGElement *)*puVar7;
    pDVar1 = (DGNode *)(pDVar3 + 0x220);
    local_50 = pDVar1;
    std::
    _Rb_tree<dg::sdg::DGNode*,dg::sdg::DGNode*,std::_Identity<dg::sdg::DGNode*>,std::less<dg::sdg::DGNode*>,std::allocator<dg::sdg::DGNode*>>
    ::_M_insert_unique<dg::sdg::DGNode*>(local_48,&local_50);
    pVVar6 = SystemDependenceGraph::getValue(this->_llvmsdg,pDVar3);
    dumpNode(this,out,pDVar1,pVVar6,(char *)0x0);
  }
  local_50 = *(DGNode **)(local_40 + 8);
  if (local_50 != (DGNode *)0x0) {
    std::
    _Rb_tree<dg::sdg::DGNode*,dg::sdg::DGNode*,std::_Identity<dg::sdg::DGNode*>,std::less<dg::sdg::DGNode*>,std::allocator<dg::sdg::DGNode*>>
    ::_M_insert_unique<dg::sdg::DGNode*const&>(local_48,&local_50);
    dumpNode(this,out,local_50,(Value *)0x0,"noret");
  }
  local_50 = *(DGNode **)(local_40 + 0x10);
  if (local_50 != (DGNode *)0x0) {
    std::
    _Rb_tree<dg::sdg::DGNode*,dg::sdg::DGNode*,std::_Identity<dg::sdg::DGNode*>,std::less<dg::sdg::DGNode*>,std::allocator<dg::sdg::DGNode*>>
    ::_M_insert_unique<dg::sdg::DGNode*const&>(local_48,&local_50);
    dumpNode(this,out,local_50,(Value *)0x0,"ret");
  }
  std::operator<<(out,"    }\n");
  return;
}

Assistant:

void dumpParams(std::ostream &out, sdg::DGParameters &params,
                    const std::string &name) const {
        /// input parameters
        out << "    subgraph cluster_params_in_" << &params << " {\n";
        out << "      label=\"" << name << " (input)\"\n";
        for (auto &param : params) {
            auto &nd = param.getInputArgument();
            dumpedNodes.insert(&nd);
            dumpNode(out, nd, _llvmsdg->getValue(&param));
        }
        out << "    }\n";

        /// output parameters
        out << "    subgraph cluster_params_out_" << &params << " {\n";
        out << "      label=\"" << name << " (output)\"\n";
        for (auto &param : params) {
            auto &nd = param.getOutputArgument();
            dumpedNodes.insert(&nd);
            dumpNode(out, nd, _llvmsdg->getValue(&param));
        }
        if (auto *noret = params.getNoReturn()) {
            dumpedNodes.insert(noret);
            dumpNode(out, *noret, nullptr, "noret");
        }
        if (auto *ret = params.getReturn()) {
            dumpedNodes.insert(ret);
            dumpNode(out, *ret, nullptr, "ret");
        }
        out << "    }\n";
    }